

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segmentation.cpp
# Opt level: O3

vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
* pobr::imgProcessing::utils::segmentation::getImageSegmentsScanMerge
            (vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             *__return_storage_ptr__,Mat *img,bool *useDiagonalDetection)

{
  Segment *this;
  pointer pSVar1;
  iterator iVar2;
  ulong uVar3;
  undefined8 uVar4;
  Segment *segment;
  pointer pSVar5;
  code *pcVar6;
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  *__range1;
  iterator __begin1;
  undefined8 uVar7;
  undefined8 *puVar8;
  reference_wrapper<pobr::imgProcessing::structs::Segment> rVar9;
  ulong uVar10;
  ulong uVar11;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *this_00;
  undefined1 auVar12 [16];
  vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,_std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>_>_>
  segmentsRefs;
  unordered_set<pobr::imgProcessing::structs::Segment_*,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::allocator<pobr::imgProcessing::structs::Segment_*>_>
  uniqSegments;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  segmentsBoundaries;
  Segment *segmentPtr;
  double lookupKernelValues [9];
  unordered_map<double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>,_std::hash<double>,_std::equal_to<double>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>_>
  touchingSegments;
  Mat lookupKernel;
  Mat segmentsIDs;
  _Any_data local_268;
  reference_wrapper<pobr::imgProcessing::structs::Segment> *local_258;
  code *local_250;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  *local_248;
  _Any_data local_240;
  code *local_230;
  code *pcStack_228;
  undefined4 local_220;
  undefined8 local_218;
  __node_base_ptr p_Stack_210;
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  local_208;
  Segment *local_1e8;
  _Any_data *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  _Hashtable<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_190;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  Mat local_f0 [96];
  matrixOps local_90 [96];
  
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  cv::Mat::Mat(local_f0,*(int *)(img + 8),*(int *)(img + 0xc),6,(Scalar_ *)&local_158);
  local_208.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_start = (Segment *)0x0;
  local_208.
  super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Segment *)0x0;
  local_190._M_buckets = &local_190._M_single_bucket;
  local_190._M_bucket_count = 1;
  local_190._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_190._M_element_count = 0;
  local_190._M_rehash_policy._M_max_load_factor = 1.0;
  local_190._M_rehash_policy._M_next_resize = 0;
  local_190._M_single_bucket = (__node_base_ptr)0x0;
  local_1d8 = 0;
  local_1c8 = 0;
  local_1b8 = 0;
  local_1a8 = 0;
  local_198 = 0;
  uStack_1d0 = 0x3ff0000000000000;
  uStack_1c0 = 0x3ff0000000000000;
  uStack_1b0 = 0x3ff0000000000000;
  uStack_1a0 = 0x3ff0000000000000;
  if (*useDiagonalDetection == true) {
    local_1d8 = 0x3ff0000000000000;
    local_1c8 = 0x3ff0000000000000;
    local_1a8 = 0x3ff0000000000000;
    local_198 = 0x3ff0000000000000;
  }
  cv::Mat::Mat((Mat *)&local_158,3,3,6,&local_1d8,0);
  pcStack_228 = std::
                _Function_handler<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:53:9)>
                ::_M_invoke;
  local_230 = std::
              _Function_handler<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:53:9)>
              ::_M_manager;
  local_268._8_8_ = 0;
  local_240._M_unused._0_8_ = (undefined8)img;
  local_240._8_8_ = &local_190;
  local_268._M_unused._M_object = operator_new(0x20);
  *(Mat **)local_268._M_unused._0_8_ = img;
  *(vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    **)((long)local_268._M_unused._0_8_ + 8) = &local_208;
  *(Mat **)((long)local_268._M_unused._0_8_ + 0x10) = local_f0;
  *(_Hashtable<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    **)((long)local_268._M_unused._0_8_ + 0x18) = &local_190;
  local_250 = std::
              _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:78:9)>
              ::_M_invoke;
  local_258 = (reference_wrapper<pobr::imgProcessing::structs::Segment> *)
              std::
              _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/segmentation.cpp:78:9)>
              ::_M_manager;
  matrixOps::applyKernel<double,double,double>
            (local_90,local_f0,(Mat *)&local_158,0.0,
             (function<double_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_const_double_&,_const_double_&)>
              *)&local_240,
             (function<void_(const_unsigned_long_&,_const_unsigned_long_&,_double_&,_double_&,_const_cv::Mat_&)>
              *)&local_268);
  cv::Mat::~Mat((Mat *)local_90);
  if (local_258 != (reference_wrapper<pobr::imgProcessing::structs::Segment> *)0x0) {
    (*(code *)local_258)(&local_268,&local_268,__destroy_functor);
  }
  if (local_230 != (code *)0x0) {
    (*local_230)(&local_240,&local_240,3);
  }
  pSVar1 = local_208.
           super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_268._M_unused._M_object = (reference_wrapper<pobr::imgProcessing::structs::Segment> *)0x0;
  local_268._8_8_ = (reference_wrapper<pobr::imgProcessing::structs::Segment> *)0x0;
  local_258 = (reference_wrapper<pobr::imgProcessing::structs::Segment> *)0x0;
  local_248 = __return_storage_ptr__;
  if (local_208.
      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_208.
      super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar4 = (reference_wrapper<pobr::imgProcessing::structs::Segment> *)0x0;
  }
  else {
    pSVar5 = local_208.
             super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
             ._M_impl.super__Vector_impl_data._M_start;
    rVar9._M_data =
         local_208.
         super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
         ._M_impl.super__Vector_impl_data._M_start;
    do {
      if ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)local_268._8_8_ == local_258)
      {
        local_240._M_unused._0_8_ = (undefined8)pSVar5;
        std::
        vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>>>
        ::_M_realloc_insert<std::reference_wrapper<pobr::imgProcessing::structs::Segment>>
                  ((vector<std::reference_wrapper<pobr::imgProcessing::structs::Segment>,std::allocator<std::reference_wrapper<pobr::imgProcessing::structs::Segment>>>
                    *)local_268._M_pod_data,(iterator)local_268._8_8_,
                   (reference_wrapper<pobr::imgProcessing::structs::Segment> *)&local_240);
      }
      else {
        *(Segment **)local_268._8_8_ = rVar9._M_data;
        local_268._8_8_ = local_268._8_8_ + 8;
      }
      pSVar5 = pSVar5 + 1;
      rVar9._M_data = rVar9._M_data + 1;
    } while (pSVar5 != pSVar1);
    uVar4 = local_268._M_unused._0_8_;
    if ((void *)local_268._8_8_ != local_268._M_unused._M_object) {
      uVar10 = 0;
      do {
        uVar4 = local_268._M_unused._0_8_;
        this = ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)
               ((long)local_268._M_unused._0_8_ + uVar10 * 8))->_M_data;
        uVar11 = uVar10 + 1;
        auVar12._8_4_ = (int)(uVar11 >> 0x20);
        auVar12._0_8_ = uVar11;
        auVar12._12_4_ = 0x45300000;
        local_240._M_unused._0_8_ =
             (undefined8)
             ((auVar12._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0));
        iVar2 = std::
                _Hashtable<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&local_190,(key_type *)&local_240);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_false>
            ._M_cur == (__node_type *)0x0) {
LAB_001094ee:
          uVar4 = std::__throw_out_of_range("_Map_base::at");
          __clang_call_terminate(uVar4);
        }
        for (puVar8 = *(undefined8 **)
                       ((long)iVar2.
                              super__Node_iterator_base<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_false>
                              ._M_cur + 0x20); puVar8 != (undefined8 *)0x0;
            puVar8 = (undefined8 *)*puVar8) {
          uVar3 = (ulong)((double)puVar8[1] + -1.0);
          uVar3 = (long)(((double)puVar8[1] + -1.0) - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
                  uVar3;
          if ((ulong)((long)(local_268._8_8_ - local_268._0_8_) >> 3) <= uVar3) {
LAB_001094e0:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_001094ee;
          }
          structs::Segment::merge
                    (this,((reference_wrapper<pobr::imgProcessing::structs::Segment> *)
                          ((long)local_268._M_unused._0_8_ + uVar3 * 8))->_M_data);
          uVar3 = (ulong)((double)puVar8[1] + -1.0);
          uVar3 = (long)(((double)puVar8[1] + -1.0) - 9.223372036854776e+18) & (long)uVar3 >> 0x3f |
                  uVar3;
          if ((ulong)((long)(local_268._8_8_ - local_268._0_8_) >> 3) <= uVar3) goto LAB_001094e0;
          ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)
          ((long)local_268._M_unused._0_8_ + uVar3 * 8))->_M_data =
               ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)(uVar4 + uVar10 * 8))->
               _M_data;
        }
        uVar4 = local_268._8_8_;
        uVar10 = uVar11;
      } while (uVar11 < (ulong)((long)(local_268._8_8_ - local_268._0_8_) >> 3));
    }
  }
  local_240._M_unused._M_object = &p_Stack_210;
  local_240._8_8_ = 1;
  local_230 = (code *)0x0;
  pcStack_228 = (code *)0x0;
  local_220 = 0x3f800000;
  local_218 = 0;
  p_Stack_210 = (__node_base_ptr)0x0;
  if (local_268._M_unused._M_object == (void *)uVar4) {
    (local_248->
    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_248->
    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_248->
    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = local_248;
  }
  else {
    uVar7 = local_268._M_unused._0_8_;
    do {
      local_1e8 = ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)uVar7)->_M_data;
      local_1e0 = &local_240;
      std::
      _Hashtable<pobr::imgProcessing::structs::Segment*,pobr::imgProcessing::structs::Segment*,std::allocator<pobr::imgProcessing::structs::Segment*>,std::__detail::_Identity,std::equal_to<pobr::imgProcessing::structs::Segment*>,std::hash<pobr::imgProcessing::structs::Segment*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<pobr::imgProcessing::structs::Segment*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<pobr::imgProcessing::structs::Segment*,false>>>>
                ((_Hashtable<pobr::imgProcessing::structs::Segment*,pobr::imgProcessing::structs::Segment*,std::allocator<pobr::imgProcessing::structs::Segment*>,std::__detail::_Identity,std::equal_to<pobr::imgProcessing::structs::Segment*>,std::hash<pobr::imgProcessing::structs::Segment*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&local_240,&local_1e8,&local_1e0);
      this_00 = local_248;
      uVar7 = uVar7 + 8;
    } while (uVar7 != uVar4);
    (local_248->
    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_248->
    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_248->
    super__Vector_base<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (pcVar6 = local_230; pcVar6 != (code *)0x0; pcVar6 = *(code **)pcVar6) {
      std::
      vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
      ::push_back(this_00,*(value_type **)((long)pcVar6 + 8));
    }
  }
  std::
  _Hashtable<pobr::imgProcessing::structs::Segment_*,_pobr::imgProcessing::structs::Segment_*,_std::allocator<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Identity,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<pobr::imgProcessing::structs::Segment_*,_pobr::imgProcessing::structs::Segment_*,_std::allocator<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Identity,_std::equal_to<pobr::imgProcessing::structs::Segment_*>,_std::hash<pobr::imgProcessing::structs::Segment_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_240);
  if ((reference_wrapper<pobr::imgProcessing::structs::Segment> *)local_268._M_unused._0_8_ !=
      (reference_wrapper<pobr::imgProcessing::structs::Segment> *)0x0) {
    operator_delete(local_268._M_unused._M_object);
  }
  cv::Mat::~Mat((Mat *)&local_158);
  std::
  _Hashtable<double,_std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>,_std::allocator<std::pair<const_double,_std::unordered_set<double,_std::hash<double>,_std::equal_to<double>,_std::allocator<double>_>_>_>,_std::__detail::_Select1st,_std::equal_to<double>,_std::hash<double>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_190);
  std::
  vector<pobr::imgProcessing::structs::Segment,_std::allocator<pobr::imgProcessing::structs::Segment>_>
  ::~vector(&local_208);
  cv::Mat::~Mat(local_f0);
  return this_00;
}

Assistant:

std::vector<structs::Segment>
segmentation::getImageSegmentsScanMerge(const cv::Mat& img, const bool& useDiagonalDetection)
{
    auto segmentsIDs = cv::Mat(
        img.rows,
        img.cols,
        CV_64F,
        0.0
    );
    std::vector<structs::Segment> segmentsBoundaries;
    std::unordered_map<double, std::unordered_set<double>> touchingSegments;

    double lookupKernelValues[9] = {
        0, 1, 0,
        1, 0, 1,
        0, 1, 0     
    };

    if (useDiagonalDetection) {
        lookupKernelValues[0] = 1;
        lookupKernelValues[2] = 1;
        lookupKernelValues[6] = 1;
        lookupKernelValues[8] = 1;
    }

    auto lookupKernel = cv::Mat(
        3,
        3,
        CV_64F,
        lookupKernelValues
    );

    // Note: Kernel application skips img edges
    //       replace with forEachPixel maybe?
    matrixOps::applyKernel<double, double, double>(
        segmentsIDs,
        lookupKernel,
        0,
        [&](const uint64_t& x, const uint64_t& y, double& accumulator, const double& segmentID, const double& kernelValue) -> double
        {
            const auto& imgPixel = img.at<cv::Vec3b>(y, x);

            if (imgPixel[0] == consts::colors::black) {
                // Short-circuit as there is nothing to do here
                return 0;
            }

            if (kernelValue == 0) {
                return accumulator;
            }

            if (accumulator != 0) {
                if (segmentID == 0 || accumulator == segmentID) {
                    return accumulator;
                }

                // Segments touching, store that information for merging phase
                touchingSegments.at(accumulator).insert(segmentID);
                touchingSegments.at(segmentID).insert(accumulator);
            }

            return segmentID;
        },
        [&](const uint64_t& x, const uint64_t& y, double& accumulator, double& setSegmentID, const cv::Mat& tt) -> void
        {
            const auto& imgPixel = img.at<cv::Vec3b>(y, x);

            if (imgPixel[0] == consts::colors::black) {
                // Short-circuit as there is nothing to do here
                return;
            }

            if (accumulator == 0) {
                // Not IDed yet, create new segment

                const auto thisSegmentID = segmentsBoundaries.size() + 1;
                structs::Segment newSegment;

                newSegment.xMin = x;
                newSegment.xMax = x;
                newSegment.yMin = y;
                newSegment.yMax = y;

                segmentsIDs.at<double>(y, x) = thisSegmentID;
                segmentsBoundaries.push_back(newSegment);
                touchingSegments.insert({ thisSegmentID, {} });
            } else {
                // Segment exists, update boundaries

                const auto thisSegmentID = accumulator;
                auto& thisSegment = segmentsBoundaries.at(thisSegmentID - 1);

                segmentsIDs.at<double>(y, x) = thisSegmentID;
                thisSegment.updateBoundaries(x, y);
            }
        }
    );

    // Merge touching segments
    std::vector<std::reference_wrapper<structs::Segment>> segmentsRefs;

    for (auto& segment: segmentsBoundaries) {
        segmentsRefs.push_back(std::ref(segment));
    }

    for (uint64_t segmentIdx = 0; segmentIdx < segmentsRefs.size(); segmentIdx++) {
        const auto& segmentRef = segmentsRefs.at(segmentIdx);
        auto& segment = segmentRef.get();
        const auto& touching = touchingSegments.at(segmentIdx + 1);

        for (const auto& touchesIdx: touching) {
            const auto& touched = segmentsRefs.at(touchesIdx - 1);

            segment.merge(touched);
            segmentsRefs.at(touchesIdx - 1) = segmentRef;
        }
    }

    std::unordered_set<structs::Segment*> uniqSegments;
    for (const auto& segment: segmentsRefs) {
        structs::Segment* segmentPtr = &(segment.get());

        uniqSegments.insert(segmentPtr);
    }

    std::vector<structs::Segment> segments;
    for (const auto& segmentPtr: uniqSegments) {
        segments.push_back((*segmentPtr));
    }

    // Note: does not update Segment's pixels

    return segments;
}